

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O2

set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
* trial::dynamic::convert::
  overloader<std::set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_void>
  ::into(set<trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>
         *__return_storage_ptr__,basic_variable<std::allocator<char>_> *container,
        error_code *param_2)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  const_reference __v;
  const_iterator __end0;
  const_iterator __begin0;
  const_iterator cStack_48;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_30;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  basic_variable<std::allocator<char>_>::begin((const_iterator *)&local_30,container);
  basic_variable<std::allocator<char>_>::end(&cStack_48,container);
  while( true ) {
    bVar2 = basic_variable<std::allocator<char>_>::const_iterator::operator!=
                      ((const_iterator *)&local_30,&cStack_48);
    if (!bVar2) break;
    __v = basic_variable<std::allocator<char>_>::
          iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
          ::value(&local_30);
    std::
    _Rb_tree<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::_Identity<trial::dynamic::basic_variable<std::allocator<char>>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>
    ::_M_insert_unique<trial::dynamic::basic_variable<std::allocator<char>>const&>
              ((_Rb_tree<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::_Identity<trial::dynamic::basic_variable<std::allocator<char>>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>
                *)__return_storage_ptr__,__v);
    basic_variable<std::allocator<char>_>::
    iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
    ::operator++(&local_30);
  }
  detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~small_union(&cStack_48.
                  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                  .current);
  detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
  ::~small_union(&local_30.current);
  return __return_storage_ptr__;
}

Assistant:

static std::set<basic_variable<Allocator>> into(const basic_variable<Allocator>& container,
                                                    std::error_code&)
    {
        std::set<basic_variable<Allocator>> result;
        for (const auto& item : container)
        {
            result.insert(item);
        }
        return result;
    }